

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O0

void nn_init(void)

{
  nn_mutex_t *unaff_retaddr;
  int in_stack_0000002c;
  nn_mutex_t *in_stack_00000030;
  nn_condvar_t *in_stack_00000038;
  
  nn_mutex_lock(unaff_retaddr);
  while ((self.flags & 2U) != 0) {
    nn_condvar_wait(in_stack_00000038,in_stack_00000030,in_stack_0000002c);
  }
  self.flags = self.flags & 0xfffffffe;
  nn_mutex_unlock(unaff_retaddr);
  return;
}

Assistant:

void nn_init (void)
{
    nn_mutex_lock (&self.lock);
    /*  Wait for any in progress term to complete. */
    while (self.flags & NN_CTX_FLAG_TERMING) {
        nn_condvar_wait (&self.cond, &self.lock, -1);
    }
    self.flags &= ~NN_CTX_FLAG_TERMED;
    nn_mutex_unlock (&self.lock);
}